

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::java::FileGenerator::GenerateDescriptorInitializationCodeForImmutable
          (FileGenerator *this,Printer *printer)

{
  char cVar1;
  __uniq_ptr_impl<google::protobuf::compiler::java::MessageGenerator,_std::default_delete<google::protobuf::compiler::java::MessageGenerator>_>
  _Var2;
  __uniq_ptr_impl<google::protobuf::compiler::java::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::java::ExtensionGenerator>_>
  _Var3;
  DescriptorPool *this_00;
  char *pcVar4;
  ClassNameResolver *this_01;
  GeneratorFactory *pGVar5;
  undefined1 auVar6 [12];
  CompressedTuple<absl::lts_20250127::container_internal::key_compare_adapter<google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_const_google::protobuf::FieldDescriptor_*>::checked_compare,_std::allocator<const_google::protobuf::FieldDescriptor_*>,_absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>,_256,_false>_>_*>
  other;
  bool bVar7;
  int iVar8;
  Descriptor *type;
  MessageLite *pMVar9;
  reference ppFVar10;
  FileDescriptor *pFVar11;
  LogMessage *this_02;
  char *extraout_RDX;
  long lVar12;
  size_type dest_i;
  char *alloc;
  allocator_type *in_R9;
  _Alloc_hider this_03;
  byte bVar13;
  int iVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  string_view text;
  string_view text_00;
  string_view name;
  string_view data;
  iterator iter;
  string_view filename;
  string_view text_01;
  string_view text_02;
  string_view text_03;
  string_view text_04;
  string_view str;
  string_view str_00;
  Metadata MVar19;
  iterator iVar20;
  iterator iVar21;
  int bytecode_estimate;
  int method_num;
  string file_data;
  DynamicMessageFactory factory;
  SharedCodeGenerator shared_code_generator;
  int local_1d8 [2];
  undefined1 local_1d0 [8];
  CompressedTuple<absl::lts_20250127::container_internal::key_compare_adapter<google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_const_google::protobuf::FieldDescriptor_*>::checked_compare,_std::allocator<const_google::protobuf::FieldDescriptor_*>,_absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>,_256,_false>_>_*>
  local_1c8;
  size_type local_1c0;
  string local_1b8;
  LogMessage local_198;
  DynamicMessageFactory local_188;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_128;
  anon_union_232_1_493b367e_for_FileDescriptorProto_3 local_118;
  
  local_128._M_allocated_capacity = (size_type)"";
  if ((this->options_).opensource_runtime == false) {
    local_128._M_allocated_capacity = (size_type)"final";
  }
  alloc = (char *)&local_128;
  text._M_str = 
  "public static com.google.protobuf.Descriptors.FileDescriptor\n    getDescriptor() {\n  return descriptor;\n}\nprivate static $final$ com.google.protobuf.Descriptors.FileDescriptor\n    descriptor;\nstatic {\n"
  ;
  text._M_len = 0xc9;
  io::Printer::Print<char[6],char_const*>(printer,text,(char (*) [6])"final",(char **)alloc);
  printer->indent_ = printer->indent_ + (printer->options_).spaces_per_indent;
  if ((this->options_).opensource_runtime == true) {
    SharedCodeGenerator::SharedCodeGenerator
              ((SharedCodeGenerator *)&local_128,this->file_,&this->options_);
    SharedCodeGenerator::GenerateDescriptors((SharedCodeGenerator *)&local_128,printer);
    SharedCodeGenerator::~SharedCodeGenerator((SharedCodeGenerator *)&local_128);
  }
  local_1d8[0] = 0;
  local_1d8[1] = 0;
  pFVar11 = this->file_;
  if (0 < pFVar11->message_type_count_) {
    lVar12 = 0;
    do {
      _Var2._M_t.
      super__Tuple_impl<0UL,_google::protobuf::compiler::java::MessageGenerator_*,_std::default_delete<google::protobuf::compiler::java::MessageGenerator>_>
      .super__Head_base<0UL,_google::protobuf::compiler::java::MessageGenerator_*,_false>.
      _M_head_impl = (this->message_generators_).
                     super__Vector_base<std::unique_ptr<google::protobuf::compiler::java::MessageGenerator,_std::default_delete<google::protobuf::compiler::java::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::java::MessageGenerator,_std::default_delete<google::protobuf::compiler::java::MessageGenerator>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[lVar12]._M_t.
                     super___uniq_ptr_impl<google::protobuf::compiler::java::MessageGenerator,_std::default_delete<google::protobuf::compiler::java::MessageGenerator>_>
                     ._M_t;
      iVar8 = (**(code **)(*(long *)_Var2._M_t.
                                    super__Tuple_impl<0UL,_google::protobuf::compiler::java::MessageGenerator_*,_std::default_delete<google::protobuf::compiler::java::MessageGenerator>_>
                                    .
                                    super__Head_base<0UL,_google::protobuf::compiler::java::MessageGenerator_*,_false>
                                    ._M_head_impl + 0x18))
                        (_Var2._M_t.
                         super__Tuple_impl<0UL,_google::protobuf::compiler::java::MessageGenerator_*,_std::default_delete<google::protobuf::compiler::java::MessageGenerator>_>
                         .
                         super__Head_base<0UL,_google::protobuf::compiler::java::MessageGenerator_*,_false>
                         ._M_head_impl,printer);
      local_1d8[0] = local_1d8[0] + iVar8;
      alloc = "private static void _clinit_autosplit_dinit_$method_num$() {\n";
      java::anon_unknown_0::MaybeRestartJavaMethod
                (printer,local_1d8,local_1d8 + 1,"_clinit_autosplit_dinit_$method_num$();\n",
                 "private static void _clinit_autosplit_dinit_$method_num$() {\n");
      lVar12 = lVar12 + 1;
      pFVar11 = this->file_;
    } while (lVar12 < pFVar11->message_type_count_);
  }
  if (0 < pFVar11->extension_count_) {
    lVar12 = 0;
    do {
      _Var3._M_t.
      super__Tuple_impl<0UL,_google::protobuf::compiler::java::ExtensionGenerator_*,_std::default_delete<google::protobuf::compiler::java::ExtensionGenerator>_>
      .super__Head_base<0UL,_google::protobuf::compiler::java::ExtensionGenerator_*,_false>.
      _M_head_impl = (this->extension_generators_).
                     super__Vector_base<std::unique_ptr<google::protobuf::compiler::java::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::java::ExtensionGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::java::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::java::ExtensionGenerator>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[lVar12]._M_t.
                     super___uniq_ptr_impl<google::protobuf::compiler::java::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::java::ExtensionGenerator>_>
                     ._M_t;
      iVar8 = (**(code **)(*(long *)_Var3._M_t.
                                    super__Tuple_impl<0UL,_google::protobuf::compiler::java::ExtensionGenerator_*,_std::default_delete<google::protobuf::compiler::java::ExtensionGenerator>_>
                                    .
                                    super__Head_base<0UL,_google::protobuf::compiler::java::ExtensionGenerator_*,_false>
                                    ._M_head_impl + 0x18))
                        (_Var3._M_t.
                         super__Tuple_impl<0UL,_google::protobuf::compiler::java::ExtensionGenerator_*,_std::default_delete<google::protobuf::compiler::java::ExtensionGenerator>_>
                         .
                         super__Head_base<0UL,_google::protobuf::compiler::java::ExtensionGenerator_*,_false>
                         ._M_head_impl,printer);
      local_1d8[0] = local_1d8[0] + iVar8;
      alloc = "private static void _clinit_autosplit_dinit_$method_num$() {\n";
      java::anon_unknown_0::MaybeRestartJavaMethod
                (printer,local_1d8,local_1d8 + 1,"_clinit_autosplit_dinit_$method_num$();\n",
                 "private static void _clinit_autosplit_dinit_$method_num$() {\n");
      lVar12 = lVar12 + 1;
    } while (lVar12 < this->file_->extension_count_);
  }
  text_00._M_str = "descriptor.resolveAllFeaturesImmutable();\n";
  text_00._M_len = 0x2a;
  io::Printer::Print<>(printer,text_00);
  local_1d0 = (undefined1  [8])
              absl::lts_20250127::container_internal::
              btree<absl::lts_20250127::container_internal::set_params<google::protobuf::FieldDescriptor_const*,google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,std::allocator<google::protobuf::FieldDescriptor_const*>,256,false>>
              ::EmptyNode()::empty_node;
  local_1c8.
  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::key_compare_adapter<google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_const_google::protobuf::FieldDescriptor_*>::checked_compare,_std::allocator<const_google::protobuf::FieldDescriptor_*>,_absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>,_256,_false>_>_*>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL>,_true>
  .
  super_Storage<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>,_256,_false>_>_*,_2UL,_false>
  .value = (CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::key_compare_adapter<google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_const_google::protobuf::FieldDescriptor_*>::checked_compare,_std::allocator<const_google::protobuf::FieldDescriptor_*>,_absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>,_256,_false>_>_*>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL>,_true>
            )absl::lts_20250127::container_internal::
             btree<absl::lts_20250127::container_internal::set_params<google::protobuf::FieldDescriptor_const*,google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,std::allocator<google::protobuf::FieldDescriptor_const*>,256,false>>
             ::EmptyNode()::empty_node;
  local_1c0 = 0;
  pFVar11 = this->file_;
  StripSourceRetentionOptions((FileDescriptorProto *)&local_128,pFVar11,false);
  local_1b8._M_string_length = 0;
  local_1b8.field_2._M_local_buf[0] = '\0';
  local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
  MessageLite::SerializeToString((MessageLite *)&local_128,&local_1b8);
  this_00 = pFVar11->pool_;
  MVar19 = FileDescriptorProto::GetMetadata
                     ((FileDescriptorProto *)_FileDescriptorProto_default_instance_);
  pcVar4 = ((MVar19.descriptor)->all_names_).payload_;
  name._M_len = (ulong)*(ushort *)(pcVar4 + 2);
  name._M_str = pcVar4 + ~name._M_len;
  type = DescriptorPool::FindMessageTypeByName(this_00,name);
  if (type != (Descriptor *)0x0) {
    DynamicMessageFactory::DynamicMessageFactory(&local_188);
    pMVar9 = &DynamicMessageFactory::GetPrototype(&local_188,type)->super_MessageLite;
    pMVar9 = MessageLite::New(pMVar9,(Arena *)0x0);
    if (pMVar9 == (MessageLite *)0x0) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_198,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/java/file.cc"
                 ,0x7d,"dynamic_file_proto.get() != nullptr");
LAB_002a2490:
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&local_198);
    }
    data._M_str = local_1b8._M_dataplus._M_p;
    data._M_len = local_1b8._M_string_length;
    bVar7 = MessageLite::ParseFromString(pMVar9,data);
    if (!bVar7) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_198,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/java/file.cc"
                 ,0x7e,"dynamic_file_proto->ParseFromString(file_data)");
      goto LAB_002a2490;
    }
    if (local_1c0 != 0) {
      absl::lts_20250127::container_internal::
      btree_node<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>,_256,_false>_>
      ::clear_and_delete((btree_node<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>,_256,_false>_>
                          *)local_1d0,(allocator_type *)&local_1c8);
    }
    local_1c8.
    super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::key_compare_adapter<google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_const_google::protobuf::FieldDescriptor_*>::checked_compare,_std::allocator<const_google::protobuf::FieldDescriptor_*>,_absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>,_256,_false>_>_*>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL>,_true>
    .
    super_Storage<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>,_256,_false>_>_*,_2UL,_false>
    .value = (CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::key_compare_adapter<google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_const_google::protobuf::FieldDescriptor_*>::checked_compare,_std::allocator<const_google::protobuf::FieldDescriptor_*>,_absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>,_256,_false>_>_*>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL>,_true>
              )absl::lts_20250127::container_internal::
               btree<absl::lts_20250127::container_internal::set_params<google::protobuf::FieldDescriptor_const*,google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,std::allocator<google::protobuf::FieldDescriptor_const*>,256,false>>
               ::EmptyNode()::empty_node;
    local_1d0 = (undefined1  [8])
                absl::lts_20250127::container_internal::
                btree<absl::lts_20250127::container_internal::set_params<google::protobuf::FieldDescriptor_const*,google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,std::allocator<google::protobuf::FieldDescriptor_const*>,256,false>>
                ::EmptyNode()::empty_node;
    local_1c0 = 0;
    bVar7 = java::anon_unknown_0::CollectExtensions
                      ((Message *)pMVar9,(FieldDescriptorSet *)local_1d0);
    if (!bVar7) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_198,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/java/file.cc"
                 ,0x82,"CollectExtensions(*dynamic_file_proto, extensions)");
      str._M_str = "Found unknown fields in FileDescriptorProto when building ";
      str._M_len = 0x3a;
      absl::lts_20250127::log_internal::LogMessage::
      CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
                (&local_198,str);
      this_02 = absl::lts_20250127::log_internal::LogMessage::operator<<
                          (&local_198,
                           (string *)
                           ((ulong)local_118._impl_.name_.tagged_ptr_.ptr_ & 0xfffffffffffffffc));
      str_00._M_str =
           ". It\'s likely that those fields are custom options, however, those options cannot be recognized in the builder pool. This normally should not happen. Please report a bug."
      ;
      str_00._M_len = 0xaa;
      absl::lts_20250127::log_internal::LogMessage::
      CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
                (this_02,str_00);
      goto LAB_002a2490;
    }
    (*pMVar9->_vptr_MessageLite[1])(pMVar9);
    DynamicMessageFactory::~DynamicMessageFactory(&local_188);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
    operator_delete(local_1b8._M_dataplus._M_p,
                    CONCAT71(local_1b8.field_2._M_allocated_capacity._1_7_,
                             local_1b8.field_2._M_local_buf[0]) + 1);
  }
  FileDescriptorProto::~FileDescriptorProto((FileDescriptorProto *)&local_128);
  if ((this->options_).strip_nonfunctional_codegen != true) {
LAB_002a213d:
    pFVar11 = this->file_;
    if (0 < pFVar11->dependency_count_) {
      iVar8 = 0;
      do {
        pFVar11 = FileDescriptor::dependency(pFVar11,iVar8);
        if (((this->options_).strip_nonfunctional_codegen != true) ||
           (filename._M_str = extraout_RDX,
           filename._M_len = (size_t)(pFVar11->name_->_M_dataplus)._M_p,
           bVar7 = IsKnownFeatureProto((compiler *)pFVar11->name_->_M_string_length,filename),
           !bVar7)) {
          this_01 = this->name_resolver_;
          pFVar11 = FileDescriptor::dependency(this->file_,iVar8);
          ClassNameResolver::GetClassName_abi_cxx11_((string *)&local_128,this_01,pFVar11,true);
          text_01._M_str = "$dependency$.getDescriptor();\n";
          text_01._M_len = 0x1e;
          io::Printer::Print<char[11],std::__cxx11::string>
                    (printer,text_01,(char (*) [11])0x688c5f,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_128
                    );
          if ((anon_union_232_1_493b367e_for_FileDescriptorProto_3 *)local_128._M_allocated_capacity
              != &local_118) {
            operator_delete((void *)local_128._M_allocated_capacity,local_118._0_8_ + 1);
          }
        }
        iVar8 = iVar8 + 1;
        pFVar11 = this->file_;
      } while (iVar8 < pFVar11->dependency_count_);
    }
    if (local_1c0 != 0) {
      text_02._M_str =
           "com.google.protobuf.ExtensionRegistry registry =\n    com.google.protobuf.ExtensionRegistry.newInstance();\n"
      ;
      text_02._M_len = 0x6a;
      io::Printer::Print<>(printer,text_02);
      iVar20 = absl::lts_20250127::container_internal::
               btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>,_256,_false>_>_>
               ::begin((btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>,_256,_false>_>_>
                        *)local_1d0);
      other.
      super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::key_compare_adapter<google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_const_google::protobuf::FieldDescriptor_*>::checked_compare,_std::allocator<const_google::protobuf::FieldDescriptor_*>,_absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>,_256,_false>_>_*>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL>,_true>
      .
      super_Storage<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>,_256,_false>_>_*,_2UL,_false>
      .value = local_1c8.
               super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::key_compare_adapter<google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_const_google::protobuf::FieldDescriptor_*>::checked_compare,_std::allocator<const_google::protobuf::FieldDescriptor_*>,_absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>,_256,_false>_>_*>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL>,_true>
               .
               super_Storage<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>,_256,_false>_>_*,_2UL,_false>
               .value;
      local_128._M_allocated_capacity = (size_type)iVar20.node_;
      local_128._8_4_ = iVar20.position_;
      if (((ulong)local_1c8.
                  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::key_compare_adapter<google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_const_google::protobuf::FieldDescriptor_*>::checked_compare,_std::allocator<const_google::protobuf::FieldDescriptor_*>,_absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>,_256,_false>_>_*>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL>,_true>
                  .
                  super_Storage<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>,_256,_false>_>_*,_2UL,_false>
                  .value & 7) != 0) goto LAB_002a23da;
      bVar7 = absl::lts_20250127::container_internal::
              btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>,_256,_false>_>,_const_google::protobuf::FieldDescriptor_*const_&,_const_google::protobuf::FieldDescriptor_*const_*>
              ::operator!=((btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>,_256,_false>_>,_const_google::protobuf::FieldDescriptor_*const_&,_const_google::protobuf::FieldDescriptor_*const_*>
                            *)&local_128,
                           (iterator *)
                           local_1c8.
                           super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::key_compare_adapter<google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_const_google::protobuf::FieldDescriptor_*>::checked_compare,_std::allocator<const_google::protobuf::FieldDescriptor_*>,_absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>,_256,_false>_>_*>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL>,_true>
                           .
                           super_Storage<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>,_256,_false>_>_*,_2UL,_false>
                           .value);
      if (bVar7) {
        do {
          ppFVar10 = absl::lts_20250127::container_internal::
                     btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>,_256,_false>_>,_const_google::protobuf::FieldDescriptor_*const_&,_const_google::protobuf::FieldDescriptor_*const_*>
                     ::operator*((btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>,_256,_false>_>,_const_google::protobuf::FieldDescriptor_*const_&,_const_google::protobuf::FieldDescriptor_*const_*>
                                  *)&local_128);
          pGVar5 = (this->generator_factory_)._M_t.
                   super___uniq_ptr_impl<google::protobuf::compiler::java::GeneratorFactory,_std::default_delete<google::protobuf::compiler::java::GeneratorFactory>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_google::protobuf::compiler::java::GeneratorFactory_*,_std::default_delete<google::protobuf::compiler::java::GeneratorFactory>_>
                   .
                   super__Head_base<0UL,_google::protobuf::compiler::java::GeneratorFactory_*,_false>
                   ._M_head_impl;
          (*pGVar5->_vptr_GeneratorFactory[4])(&local_188,pGVar5,*ppFVar10);
          iVar8 = (**(code **)(*local_188.super_MessageFactory._vptr_MessageFactory + 0x20))
                            (local_188.super_MessageFactory._vptr_MessageFactory,printer);
          local_1d8[0] = local_1d8[0] + iVar8;
          java::anon_unknown_0::MaybeRestartJavaMethod
                    (printer,local_1d8,local_1d8 + 1,
                     "_clinit_autosplit_dinit_$method_num$(registry);\n",
                     "private static void _clinit_autosplit_dinit_$method_num$(\n    com.google.protobuf.ExtensionRegistry registry) {\n"
                    );
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_188.super_MessageFactory._vptr_MessageFactory !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0) {
            (**(code **)(*local_188.super_MessageFactory._vptr_MessageFactory + 8))();
          }
          absl::lts_20250127::container_internal::
          btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>,_256,_false>_>,_const_google::protobuf::FieldDescriptor_*const_&,_const_google::protobuf::FieldDescriptor_*const_*>
          ::operator++((btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>,_256,_false>_>,_const_google::protobuf::FieldDescriptor_*const_&,_const_google::protobuf::FieldDescriptor_*const_*>
                        *)&local_128);
          bVar7 = absl::lts_20250127::container_internal::
                  btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>,_256,_false>_>,_const_google::protobuf::FieldDescriptor_*const_&,_const_google::protobuf::FieldDescriptor_*const_*>
                  ::operator!=((btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>,_256,_false>_>,_const_google::protobuf::FieldDescriptor_*const_&,_const_google::protobuf::FieldDescriptor_*const_*>
                                *)&local_128,
                               (iterator *)
                               other.
                               super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::key_compare_adapter<google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_const_google::protobuf::FieldDescriptor_*>::checked_compare,_std::allocator<const_google::protobuf::FieldDescriptor_*>,_absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>,_256,_false>_>_*>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL>,_true>
                               .
                               super_Storage<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>,_256,_false>_>_*,_2UL,_false>
                               .value);
        } while (bVar7);
      }
      text_03._M_str =
           "com.google.protobuf.Descriptors.FileDescriptor\n    .internalUpdateFileDescriptor(descriptor, registry);\n"
      ;
      text_03._M_len = 0x68;
      io::Printer::Print<>(printer,text_03);
    }
    io::Printer::Outdent(printer);
    text_04._M_str = "}\n";
    text_04._M_len = 2;
    io::Printer::Print<>(printer,text_04);
    if (local_1c0 != 0) {
      absl::lts_20250127::container_internal::
      btree_node<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>,_256,_false>_>
      ::clear_and_delete((btree_node<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>,_256,_false>_>
                          *)local_1d0,(allocator_type *)&local_1c8);
    }
    return;
  }
  iVar20 = absl::lts_20250127::container_internal::
           btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>,_256,_false>_>_>
           ::begin((btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>,_256,_false>_>_>
                    *)local_1d0);
  local_1b8._M_dataplus._M_p = (pointer)iVar20.node_;
  local_1b8._M_string_length = CONCAT44(local_1b8._M_string_length._4_4_,iVar20.position_);
  if (((ulong)local_1c8.
              super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::key_compare_adapter<google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_const_google::protobuf::FieldDescriptor_*>::checked_compare,_std::allocator<const_google::protobuf::FieldDescriptor_*>,_absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>,_256,_false>_>_*>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL>,_true>
              .
              super_Storage<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>,_256,_false>_>_*,_2UL,_false>
              .value & 7) == 0) {
    local_138 = 0x702e656c676f6f67;
    uStack_130 = 0x2e6675626f746f72;
    local_148 = 0x65462e6675626f74;
    uStack_140 = 0x7465536572757461;
    do {
      bVar7 = absl::lts_20250127::container_internal::
              btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>,_256,_false>_>,_const_google::protobuf::FieldDescriptor_*const_&,_const_google::protobuf::FieldDescriptor_*const_*>
              ::operator!=((btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>,_256,_false>_>,_const_google::protobuf::FieldDescriptor_*const_&,_const_google::protobuf::FieldDescriptor_*const_*>
                            *)&local_1b8,
                           (iterator *)
                           local_1c8.
                           super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::key_compare_adapter<google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_const_google::protobuf::FieldDescriptor_*>::checked_compare,_std::allocator<const_google::protobuf::FieldDescriptor_*>,_absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>,_256,_false>_>_*>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL>,_true>
                           .
                           super_Storage<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>,_256,_false>_>_*,_2UL,_false>
                           .value);
      if (!bVar7) goto LAB_002a213d;
      ppFVar10 = absl::lts_20250127::container_internal::
                 btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>,_256,_false>_>,_const_google::protobuf::FieldDescriptor_*const_&,_const_google::protobuf::FieldDescriptor_*const_*>
                 ::operator*((btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>,_256,_false>_>,_const_google::protobuf::FieldDescriptor_*const_&,_const_google::protobuf::FieldDescriptor_*const_*>
                              *)&local_1b8);
      this_03._M_p = local_1b8._M_dataplus._M_p;
      pcVar4 = ((*ppFVar10)->containing_type_->all_names_).payload_;
      if (*(short *)(pcVar4 + 2) == 0x1a) {
        auVar17[0] = -(pcVar4[-0x11] == (char)local_148);
        auVar17[1] = -(pcVar4[-0x10] == local_148._1_1_);
        auVar17[2] = -(pcVar4[-0xf] == local_148._2_1_);
        auVar17[3] = -(pcVar4[-0xe] == local_148._3_1_);
        auVar17[4] = -(pcVar4[-0xd] == local_148._4_1_);
        auVar17[5] = -(pcVar4[-0xc] == local_148._5_1_);
        auVar17[6] = -(pcVar4[-0xb] == local_148._6_1_);
        auVar17[7] = -(pcVar4[-10] == local_148._7_1_);
        auVar17[8] = -(pcVar4[-9] == (char)uStack_140);
        auVar17[9] = -(pcVar4[-8] == uStack_140._1_1_);
        auVar17[10] = -(pcVar4[-7] == uStack_140._2_1_);
        auVar17[0xb] = -(pcVar4[-6] == uStack_140._3_1_);
        auVar17[0xc] = -(pcVar4[-5] == uStack_140._4_1_);
        auVar17[0xd] = -(pcVar4[-4] == uStack_140._5_1_);
        auVar17[0xe] = -(pcVar4[-3] == uStack_140._6_1_);
        auVar17[0xf] = -(pcVar4[-2] == uStack_140._7_1_);
        auVar15[0] = -(pcVar4[-0x1b] == (char)local_138);
        auVar15[1] = -(pcVar4[-0x1a] == local_138._1_1_);
        auVar15[2] = -(pcVar4[-0x19] == local_138._2_1_);
        auVar15[3] = -(pcVar4[-0x18] == local_138._3_1_);
        auVar15[4] = -(pcVar4[-0x17] == local_138._4_1_);
        auVar15[5] = -(pcVar4[-0x16] == local_138._5_1_);
        auVar15[6] = -(pcVar4[-0x15] == local_138._6_1_);
        auVar15[7] = -(pcVar4[-0x14] == local_138._7_1_);
        auVar15[8] = -(pcVar4[-0x13] == (char)uStack_130);
        auVar15[9] = -(pcVar4[-0x12] == uStack_130._1_1_);
        auVar15[10] = -(pcVar4[-0x11] == uStack_130._2_1_);
        auVar15[0xb] = -(pcVar4[-0x10] == uStack_130._3_1_);
        auVar15[0xc] = -(pcVar4[-0xf] == uStack_130._4_1_);
        auVar15[0xd] = -(pcVar4[-0xe] == uStack_130._5_1_);
        auVar15[0xe] = -(pcVar4[-0xd] == uStack_130._6_1_);
        auVar15[0xf] = -(pcVar4[-0xc] == uStack_130._7_1_);
        auVar15 = auVar15 & auVar17;
        if ((ushort)((ushort)(SUB161(auVar15 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar15 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar15 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar15 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar15 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar15 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar15 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar15 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar15 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar15 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar15 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar15 >> 0x5f,0) & 1) << 0xb |
                     (ushort)(SUB161(auVar15 >> 0x67,0) & 1) << 0xc |
                     (ushort)(SUB161(auVar15 >> 0x6f,0) & 1) << 0xd |
                     (ushort)(SUB161(auVar15 >> 0x77,0) & 1) << 0xe |
                    (ushort)(byte)(auVar15[0xf] >> 7) << 0xf) != 0xffff) goto LAB_002a1f7f;
        if (((ulong)local_1b8._M_dataplus._M_p & 7) != 0) break;
        if (local_1b8._M_dataplus._M_p[0xb] == '\0') {
          dest_i = (size_type)(int)local_1b8._M_string_length;
          local_188.super_MessageFactory._vptr_MessageFactory =
               (_func_int **)local_1b8._M_dataplus._M_p;
          local_188.pool_._0_4_ = (int)local_1b8._M_string_length;
          cVar1 = local_1b8._M_dataplus._M_p[0xb];
          if (cVar1 == '\0') {
            absl::lts_20250127::container_internal::
            btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>,_256,_false>_>,_const_google::protobuf::FieldDescriptor_*const_&,_const_google::protobuf::FieldDescriptor_*const_*>
            ::operator--((btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>,_256,_false>_>,_const_google::protobuf::FieldDescriptor_*const_&,_const_google::protobuf::FieldDescriptor_*const_*>
                          *)&local_188);
            if (((ulong)local_188.super_MessageFactory._vptr_MessageFactory & 7) != 0) break;
            if (*(char *)((long)local_188.super_MessageFactory._vptr_MessageFactory + 0xb) == '\0')
            {
              __assert_fail("iter.node_->is_leaf()",
                            "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/btree.h"
                            ,0x98c,
                            "iterator absl::container_internal::btree<absl::container_internal::set_params<const google::protobuf::FieldDescriptor *, google::protobuf::compiler::java::(anonymous namespace)::FieldDescriptorCompare, std::allocator<const google::protobuf::FieldDescriptor *>, 256, false>>::erase(iterator) [Params = absl::container_internal::set_params<const google::protobuf::FieldDescriptor *, google::protobuf::compiler::java::(anonymous namespace)::FieldDescriptorCompare, std::allocator<const google::protobuf::FieldDescriptor *>, 256, false>]"
                           );
            }
            absl::lts_20250127::container_internal::
            btree_node<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>,_256,_false>_>
            ::transfer((btree_node<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>,_256,_false>_>
                        *)this_03._M_p,dest_i,(long)(int)local_188.pool_,
                       (btree_node<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>,_256,_false>_>
                        *)local_188.super_MessageFactory._vptr_MessageFactory,
                       (allocator_type *)alloc);
            this_03._M_p = (pointer)local_188.super_MessageFactory._vptr_MessageFactory;
          }
          else {
            bVar13 = (char)local_1b8._M_string_length + 1;
            alloc = local_1b8._M_dataplus._M_p;
            absl::lts_20250127::container_internal::
            btree_node<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>,_256,_false>_>
            ::transfer_n((btree_node<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>,_256,_false>_>
                          *)local_1b8._M_dataplus._M_p,
                         (ulong)(byte)(local_1b8._M_dataplus._M_p[10] - bVar13),dest_i,(ulong)bVar13
                         ,(btree_node<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>,_256,_false>_>
                           *)local_1b8._M_dataplus._M_p,in_R9);
          }
          if (((ulong)this_03._M_p & 7) != 0) break;
          this_03._M_p[10] = this_03._M_p[10] + -1;
          local_1c0 = local_1c0 - 1;
          iVar21.position_ = (int)local_188.pool_;
          iVar21.node_ = (btree_node<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorInfo>_>,_256,_false>_>
                          *)this_03._M_p;
          iVar21._12_4_ = 0;
          iVar21 = absl::lts_20250127::container_internal::
                   btree<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>,_256,_false>_>
                   ::rebalance_after_delete
                             ((btree<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>,_256,_false>_>
                               *)local_1d0,iVar21);
          auVar6 = iVar21._0_12_;
          local_128._M_allocated_capacity = (size_type)iVar21.node_;
          local_128._8_4_ = iVar21.position_;
          if (cVar1 == '\0') {
            absl::lts_20250127::container_internal::
            btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>,_256,_false>_>,_const_google::protobuf::FieldDescriptor_*const_&,_const_google::protobuf::FieldDescriptor_*const_*>
            ::operator++((btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>,_256,_false>_>,_const_google::protobuf::FieldDescriptor_*const_&,_const_google::protobuf::FieldDescriptor_*const_*>
                          *)&local_128);
            auVar6._8_4_ = local_128._8_4_;
            auVar6._0_8_ = local_128._M_allocated_capacity;
          }
        }
        else {
          iVar8 = (int)local_1b8._M_string_length + 1;
          bVar13 = local_1b8._M_dataplus._M_p[10];
          iVar14 = (int)local_1b8._M_string_length;
          local_1b8._M_string_length._0_4_ = iVar8;
          if (iVar8 < (int)(uint)bVar13) {
            do {
              ppFVar10 = absl::lts_20250127::container_internal::
                         btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>,_256,_false>_>,_const_google::protobuf::FieldDescriptor_*const_&,_const_google::protobuf::FieldDescriptor_*const_*>
                         ::operator*((btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>,_256,_false>_>,_const_google::protobuf::FieldDescriptor_*const_&,_const_google::protobuf::FieldDescriptor_*const_*>
                                      *)&local_1b8);
              pcVar4 = ((*ppFVar10)->containing_type_->all_names_).payload_;
              if (*(short *)(pcVar4 + 2) == 0x1a) {
                auVar18[0] = -(pcVar4[-0x11] == (char)local_148);
                auVar18[1] = -(pcVar4[-0x10] == local_148._1_1_);
                auVar18[2] = -(pcVar4[-0xf] == local_148._2_1_);
                auVar18[3] = -(pcVar4[-0xe] == local_148._3_1_);
                auVar18[4] = -(pcVar4[-0xd] == local_148._4_1_);
                auVar18[5] = -(pcVar4[-0xc] == local_148._5_1_);
                auVar18[6] = -(pcVar4[-0xb] == local_148._6_1_);
                auVar18[7] = -(pcVar4[-10] == local_148._7_1_);
                auVar18[8] = -(pcVar4[-9] == (char)uStack_140);
                auVar18[9] = -(pcVar4[-8] == uStack_140._1_1_);
                auVar18[10] = -(pcVar4[-7] == uStack_140._2_1_);
                auVar18[0xb] = -(pcVar4[-6] == uStack_140._3_1_);
                auVar18[0xc] = -(pcVar4[-5] == uStack_140._4_1_);
                auVar18[0xd] = -(pcVar4[-4] == uStack_140._5_1_);
                auVar18[0xe] = -(pcVar4[-3] == uStack_140._6_1_);
                auVar18[0xf] = -(pcVar4[-2] == uStack_140._7_1_);
                auVar16[0] = -(pcVar4[-0x1b] == (char)local_138);
                auVar16[1] = -(pcVar4[-0x1a] == local_138._1_1_);
                auVar16[2] = -(pcVar4[-0x19] == local_138._2_1_);
                auVar16[3] = -(pcVar4[-0x18] == local_138._3_1_);
                auVar16[4] = -(pcVar4[-0x17] == local_138._4_1_);
                auVar16[5] = -(pcVar4[-0x16] == local_138._5_1_);
                auVar16[6] = -(pcVar4[-0x15] == local_138._6_1_);
                auVar16[7] = -(pcVar4[-0x14] == local_138._7_1_);
                auVar16[8] = -(pcVar4[-0x13] == (char)uStack_130);
                auVar16[9] = -(pcVar4[-0x12] == uStack_130._1_1_);
                auVar16[10] = -(pcVar4[-0x11] == uStack_130._2_1_);
                auVar16[0xb] = -(pcVar4[-0x10] == uStack_130._3_1_);
                auVar16[0xc] = -(pcVar4[-0xf] == uStack_130._4_1_);
                auVar16[0xd] = -(pcVar4[-0xe] == uStack_130._5_1_);
                auVar16[0xe] = -(pcVar4[-0xd] == uStack_130._6_1_);
                auVar16[0xf] = -(pcVar4[-0xc] == uStack_130._7_1_);
                auVar16 = auVar16 & auVar18;
                if ((ushort)((ushort)(SUB161(auVar16 >> 7,0) & 1) |
                             (ushort)(SUB161(auVar16 >> 0xf,0) & 1) << 1 |
                             (ushort)(SUB161(auVar16 >> 0x17,0) & 1) << 2 |
                             (ushort)(SUB161(auVar16 >> 0x1f,0) & 1) << 3 |
                             (ushort)(SUB161(auVar16 >> 0x27,0) & 1) << 4 |
                             (ushort)(SUB161(auVar16 >> 0x2f,0) & 1) << 5 |
                             (ushort)(SUB161(auVar16 >> 0x37,0) & 1) << 6 |
                             (ushort)(SUB161(auVar16 >> 0x3f,0) & 1) << 7 |
                             (ushort)(SUB161(auVar16 >> 0x47,0) & 1) << 8 |
                             (ushort)(SUB161(auVar16 >> 0x4f,0) & 1) << 9 |
                             (ushort)(SUB161(auVar16 >> 0x57,0) & 1) << 10 |
                             (ushort)(SUB161(auVar16 >> 0x5f,0) & 1) << 0xb |
                             (ushort)(SUB161(auVar16 >> 0x67,0) & 1) << 0xc |
                             (ushort)(SUB161(auVar16 >> 0x6f,0) & 1) << 0xd |
                             (ushort)(SUB161(auVar16 >> 0x77,0) & 1) << 0xe |
                            (ushort)(byte)(auVar16[0xf] >> 7) << 0xf) != 0xffff) goto LAB_002a2010;
              }
              else {
LAB_002a2010:
                lVar12 = (long)iVar14;
                iVar14 = iVar14 + 1;
                *(undefined8 *)(this_03._M_p + lVar12 * 8 + 0x10) =
                     *(undefined8 *)
                      (this_03._M_p + (long)(int)local_1b8._M_string_length * 8 + 0x10);
              }
              local_1b8._M_string_length._0_4_ = (int)local_1b8._M_string_length + 1;
              bVar13 = this_03._M_p[10];
            } while ((int)local_1b8._M_string_length < (int)(uint)bVar13);
          }
          local_1c0 = local_1c0 - (long)(int)((uint)bVar13 - iVar14);
          this_03._M_p[10] = (char)iVar14;
          local_1b8._M_string_length = CONCAT44(local_1b8._M_string_length._4_4_,iVar14);
          iter.position_ = iVar14;
          iter.node_ = (btree_node<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorInfo>_>,_256,_false>_>
                        *)local_1b8._M_dataplus._M_p;
          iter._12_4_ = 0;
          iVar21 = absl::lts_20250127::container_internal::
                   btree<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>,_256,_false>_>
                   ::rebalance_after_delete
                             ((btree<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>,_256,_false>_>
                               *)local_1d0,iter);
          auVar6 = iVar21._0_12_;
        }
        local_1b8._M_dataplus._M_p = auVar6._0_8_;
        local_1b8._M_string_length = CONCAT44(local_1b8._M_string_length._4_4_,auVar6._8_4_);
      }
      else {
LAB_002a1f7f:
        absl::lts_20250127::container_internal::
        btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>,_256,_false>_>,_const_google::protobuf::FieldDescriptor_*const_&,_const_google::protobuf::FieldDescriptor_*const_*>
        ::operator++((btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>,_256,_false>_>,_const_google::protobuf::FieldDescriptor_*const_&,_const_google::protobuf::FieldDescriptor_*const_*>
                      *)&local_1b8);
      }
    } while (((ulong)local_1c8.
                     super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::key_compare_adapter<google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_const_google::protobuf::FieldDescriptor_*>::checked_compare,_std::allocator<const_google::protobuf::FieldDescriptor_*>,_absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>,_256,_false>_>_*>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL>,_true>
                     .
                     super_Storage<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>,_256,_false>_>_*,_2UL,_false>
                     .value & 7) == 0);
  }
LAB_002a23da:
  __assert_fail("reinterpret_cast<uintptr_t>(p) % alignment == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/layout.h"
                ,0x1fe,
                "CopyConst<Char, ElementType<N>> *absl::container_internal::internal_layout::LayoutImpl<std::tuple<absl::container_internal::btree_node<absl::container_internal::set_params<const google::protobuf::FieldDescriptor *, google::protobuf::compiler::java::(anonymous namespace)::FieldDescriptorCompare, std::allocator<const google::protobuf::FieldDescriptor *>, 256, false>> *, unsigned int, unsigned char, const google::protobuf::FieldDescriptor *, absl::container_internal::btree_node<absl::container_internal::set_params<const google::protobuf::FieldDescriptor *, google::protobuf::compiler::java::(anonymous namespace)::FieldDescriptorCompare, std::allocator<const google::protobuf::FieldDescriptor *>, 256, false>> *>, std::integer_sequence<unsigned long, 1, 0, 4, 30, 31>, std::integer_sequence<unsigned long>, std::integer_sequence<unsigned long, 0, 1, 2, 3, 4>, std::integer_sequence<unsigned long, 0, 1, 2, 3, 4>>::Pointer(Char *) const [Elements = std::tuple<absl::container_internal::btree_node<absl::container_internal::set_params<const google::protobuf::FieldDescriptor *, google::protobuf::compiler::java::(anonymous namespace)::FieldDescriptorCompare, std::allocator<const google::protobuf::FieldDescriptor *>, 256, false>> *, unsigned int, unsigned char, const google::protobuf::FieldDescriptor *, absl::container_internal::btree_node<absl::container_internal::set_params<const google::protobuf::FieldDescriptor *, google::protobuf::compiler::java::(anonymous namespace)::FieldDescriptorCompare, std::allocator<const google::protobuf::FieldDescriptor *>, 256, false>> *>, StaticSizeSeq = std::integer_sequence<unsigned long, 1, 0, 4, 30, 31>, RuntimeSizeSeq = std::integer_sequence<unsigned long>, SizeSeq = std::integer_sequence<unsigned long, 0, 1, 2, 3, 4>, OffsetSeq = std::integer_sequence<unsigned long, 0, 1, 2, 3, 4>, N = 2UL, Char = const char]"
               );
}

Assistant:

void FileGenerator::GenerateDescriptorInitializationCodeForImmutable(
    io::Printer* printer) {
  printer->Print(
      "public static com.google.protobuf.Descriptors.FileDescriptor\n"
      "    getDescriptor() {\n"
      "  return descriptor;\n"
      "}\n"
      "private static $final$ com.google.protobuf.Descriptors.FileDescriptor\n"
      "    descriptor;\n"
      "static {\n",
      // TODO: Mark this as final.
      "final", options_.opensource_runtime ? "" : "final");
  printer->Indent();

  if (options_.opensource_runtime) {
    SharedCodeGenerator shared_code_generator(file_, options_);
    shared_code_generator.GenerateDescriptors(printer);
  } else {
  }

  int bytecode_estimate = 0;
  int method_num = 0;

  for (int i = 0; i < file_->message_type_count(); i++) {
    bytecode_estimate +=
        message_generators_[i]->GenerateStaticVariableInitializers(printer);
    MaybeRestartJavaMethod(
        printer, &bytecode_estimate, &method_num,
        "_clinit_autosplit_dinit_$method_num$();\n",
        "private static void _clinit_autosplit_dinit_$method_num$() {\n");
  }
  for (int i = 0; i < file_->extension_count(); i++) {
    bytecode_estimate +=
        extension_generators_[i]->GenerateNonNestedInitializationCode(printer);
    MaybeRestartJavaMethod(
        printer, &bytecode_estimate, &method_num,
        "_clinit_autosplit_dinit_$method_num$();\n",
        "private static void _clinit_autosplit_dinit_$method_num$() {\n");
  }
  // Feature resolution for Java features uses extension registry
  // which must happen after internalInit() from
  // GenerateNonNestedInitializationCode
  printer->Print("descriptor.resolveAllFeaturesImmutable();\n");

  // Proto compiler builds a DescriptorPool, which holds all the descriptors to
  // generate, when processing the ".proto" files. We call this DescriptorPool
  // the parsed pool (a.k.a. file_->pool()).
  //
  // Note that when users try to extend the (.*)DescriptorProto in their
  // ".proto" files, it does not affect the pre-built FileDescriptorProto class
  // in proto compiler. When we put the descriptor data in the file_proto, those
  // extensions become unknown fields.
  //
  // Now we need to find out all the extension value to the (.*)DescriptorProto
  // in the file_proto message, and prepare an ExtensionRegistry to return.
  //
  // To find those extensions, we need to parse the data into a dynamic message
  // of the FileDescriptor based on the builder-pool, then we can use
  // reflections to find all extension fields
  FieldDescriptorSet extensions;
  CollectExtensions(*file_, &extensions);

  if (options_.strip_nonfunctional_codegen) {
    // Skip feature extensions, which are a visible (but non-functional)
    // deviation between editions and legacy syntax.
    absl::erase_if(extensions, [](const FieldDescriptor* field) {
      return field->containing_type()->full_name() == "google.protobuf.FeatureSet";
    });
  }

  // Force descriptor initialization of all dependencies.
  for (int i = 0; i < file_->dependency_count(); i++) {
    if (ShouldIncludeDependency(file_->dependency(i), true)) {
      std::string dependency =
          name_resolver_->GetImmutableClassName(file_->dependency(i));
      printer->Print("$dependency$.getDescriptor();\n", "dependency",
                     dependency);
    }
  }

  if (!extensions.empty()) {
    // Must construct an ExtensionRegistry containing all existing extensions
    // and use it to parse the descriptor data again to recognize extensions.
    printer->Print(
        "com.google.protobuf.ExtensionRegistry registry =\n"
        "    com.google.protobuf.ExtensionRegistry.newInstance();\n");
    FieldDescriptorSet::iterator it;
    for (const FieldDescriptor* field : extensions) {
      std::unique_ptr<ExtensionGenerator> generator(
          generator_factory_->NewExtensionGenerator(field));
      bytecode_estimate += generator->GenerateRegistrationCode(printer);
      MaybeRestartJavaMethod(
          printer, &bytecode_estimate, &method_num,
          "_clinit_autosplit_dinit_$method_num$(registry);\n",
          "private static void _clinit_autosplit_dinit_$method_num$(\n"
          "    com.google.protobuf.ExtensionRegistry registry) {\n");
    }
    printer->Print(
        "com.google.protobuf.Descriptors.FileDescriptor\n"
        "    .internalUpdateFileDescriptor(descriptor, registry);\n");
  }

  printer->Outdent();
  printer->Print("}\n");
}